

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O3

CRuleSet * allocator_default<CTilesetMapper::CRuleSet>::alloc_array(int size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  CRule *pCVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar6 = (ulong)size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6;
  uVar2 = SUB168(auVar1 * ZEXT816(0x98),0);
  uVar5 = uVar2 + 8;
  if (0xfffffffffffffff7 < uVar2) {
    uVar5 = 0xffffffffffffffff;
  }
  if (SUB168(auVar1 * ZEXT816(0x98),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  puVar3 = (ulong *)operator_new__(uVar5);
  *puVar3 = uVar6;
  if (size != 0) {
    lVar7 = 0;
    do {
      *(undefined8 *)((long)puVar3 + lVar7 + 0x90) = 0;
      *(undefined4 *)((long)puVar3 + lVar7 + 0x98) = 1;
      pCVar4 = allocator_default<CTilesetMapper::CRule>::alloc_array(1);
      *(CRule **)((long)puVar3 + lVar7 + 0x90) = pCVar4;
      *(undefined4 *)((long)puVar3 + lVar7 + 0x9c) = 0;
      lVar7 = lVar7 + 0x98;
    } while (uVar6 * 0x98 - lVar7 != 0);
  }
  return (CRuleSet *)(puVar3 + 1);
}

Assistant:

static T *alloc_array(int size) { return new T [size]; }